

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.c
# Opt level: O2

int Mig_ManSuppSizeOne(Mig_Obj_t *pObj)

{
  int iVar1;
  int in_EDX;
  uint iObj;
  long lVar2;
  
  lVar2 = *(long *)((long)pObj + (-0x10 - (ulong)(((uint)pObj->pFans[3] & 0x1ffe) << 3)));
  if (*(long *)(lVar2 + 0x60) == 0) {
    Vec_IntFill((Vec_Int_t *)(lVar2 + 0x58),*(int *)(lVar2 + 8) + 500,in_EDX);
    lVar2 = *(long *)((long)pObj + (-0x10 - (ulong)(((uint)pObj->pFans[3] & 0x1ffe) << 3)));
  }
  *(int *)(lVar2 + 0x54) = *(int *)(lVar2 + 0x54) + 1;
  iObj = (uint)pObj->pFans[3] >> 1;
  iVar1 = Mig_ManSuppSize2_rec
                    (*(Mig_Man_t **)((long)pObj + (-0x10 - (ulong)((iObj & 0xfff) << 4))),iObj);
  return iVar1;
}

Assistant:

int Mig_ManSuppSizeOne( Mig_Obj_t * pObj )
{
    Mig_ObjIncrementTravId( pObj );
//    return Mig_ManSuppSize_rec( pObj );
    return Mig_ManSuppSize2_rec( Mig_ObjMan(pObj), Mig_ObjId(pObj) );
}